

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

statement_base * __thiscall
cs::method_struct::translate
          (method_struct *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  value_type ptVar1;
  compiler_type *this_00;
  _Elt_pointer pdVar2;
  int iVar3;
  const_reference pptVar4;
  token_base **pptVar5;
  size_type sVar6;
  statement_struct *this_01;
  _Elt_pointer pptVar7;
  compile_error *pcVar8;
  internal_error *this_02;
  _Elt_pointer ppsVar9;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *ast;
  _Elt_pointer ppsVar10;
  _Map_pointer pppsVar11;
  allocator_type local_1b9;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> body;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  local_168;
  string name;
  _Self local_98;
  _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
  local_78;
  _Self local_50;
  
  pptVar4 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      ((raw->
                       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                       )._M_impl.super__Deque_impl_data._M_start._M_cur,1);
  ptVar1 = *pptVar4;
  body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)ptVar1[1]._vptr_token_base;
  pptVar5 = tree_type<cs::token_base_*>::iterator::data((iterator *)&body);
  if (*pptVar5 == (token_base *)0x0) {
    this_02 = (internal_error *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&body,"Null pointer accessed.",(allocator *)&local_168);
    internal_error::internal_error(this_02,(string *)&body);
    __cxa_throw(this_02,&internal_error::typeinfo,internal_error::~internal_error);
  }
  body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)ptVar1[1]._vptr_token_base;
  pptVar5 = tree_type<cs::token_base_*>::iterator::data((iterator *)&body);
  iVar3 = (*(*pptVar5)->_vptr_token_base[2])();
  if (iVar3 == 4) {
    body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
    super__Deque_impl_data._M_map = (_Map_pointer)ptVar1[1]._vptr_token_base;
    pptVar5 = tree_type<cs::token_base_*>::iterator::data((iterator *)&body);
    std::__cxx11::string::string((string *)&name,(string *)(*pptVar5 + 3));
    std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::_Deque_base
              (&body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>)
    ;
    this_00 = (((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
              ->compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_98._M_cur =
         (raw->
         super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
         )._M_impl.super__Deque_impl_data._M_start._M_cur;
    local_98._M_first =
         (raw->
         super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
         )._M_impl.super__Deque_impl_data._M_start._M_first;
    local_98._M_last =
         (raw->
         super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
         )._M_impl.super__Deque_impl_data._M_start._M_last;
    local_98._M_node =
         (raw->
         super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
         )._M_impl.super__Deque_impl_data._M_start._M_node;
    std::operator+(&local_50,&local_98,1);
    local_78._M_cur =
         (raw->
         super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
         )._M_impl.super__Deque_impl_data._M_finish._M_cur;
    local_78._M_first =
         (raw->
         super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
         )._M_impl.super__Deque_impl_data._M_finish._M_first;
    local_78._M_last =
         (raw->
         super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
         )._M_impl.super__Deque_impl_data._M_finish._M_last;
    local_78._M_node =
         (raw->
         super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
         )._M_impl.super__Deque_impl_data._M_finish._M_node;
    std::
    deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
    ::
    deque<std::_Deque_iterator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const&,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const*>,void>
              ((deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
                *)&local_168,&local_50,&local_78,&local_1b9);
    ast = &local_168;
    compiler_type::translate(this_00,ast,&body);
    std::
    deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
    ::~deque(&local_168);
    ppsVar9 = body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
              _M_impl.super__Deque_impl_data._M_start._M_last;
    ppsVar10 = body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
               _M_impl.super__Deque_impl_data._M_start._M_cur;
    pppsVar11 = body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
                _M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      if (ppsVar10 ==
          body.super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_cur) {
        sVar6 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::size
                          ((raw->
                           super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                           )._M_impl.super__Deque_impl_data._M_start._M_cur);
        if (sVar6 == 5) {
          this_01 = (statement_struct *)
                    statement_base::operator_new((statement_base *)0x130,(size_t)ast);
          pptVar4 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                              ((raw->
                               super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                               )._M_impl.super__Deque_impl_data._M_start._M_cur,3);
          pdVar2 = (raw->
                   super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                   )._M_impl.super__Deque_impl_data._M_start._M_cur;
          pptVar7 = (pdVar2->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (pptVar7 ==
              (pdVar2->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
              _M_impl.super__Deque_impl_data._M_finish._M_first) {
            pptVar7 = (pdVar2->
                      super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                      _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
          }
          statement_struct::statement_struct
                    (this_01,&name,(tree_type<cs::token_base_*> *)(*pptVar4 + 1),&body,context,
                     pptVar7[-1]);
        }
        else {
          this_01 = (statement_struct *)
                    statement_base::operator_new((statement_base *)0x130,(size_t)ast);
          local_168.
          super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
          pdVar2 = (raw->
                   super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                   )._M_impl.super__Deque_impl_data._M_start._M_cur;
          pptVar7 = (pdVar2->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (pptVar7 ==
              (pdVar2->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
              _M_impl.super__Deque_impl_data._M_finish._M_first) {
            pptVar7 = (pdVar2->
                      super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                      _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
          }
          statement_struct::statement_struct
                    (this_01,&name,(tree_type<cs::token_base_*> *)&local_168,&body,context,
                     pptVar7[-1]);
          tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)&local_168);
        }
        std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
                  (&body.
                    super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>);
        std::__cxx11::string::~string((string *)&name);
        return &this_01->super_statement_base;
      }
      iVar3 = (*(*ppsVar10)->_vptr_statement_base[2])();
      if (iVar3 != 7) {
        if (iVar3 != 0x17) {
          pcVar8 = (compile_error *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string
                    ((string *)&local_168,"Unexpected statement in structure definition.",
                     (allocator *)&local_98);
          compile_error::compile_error(pcVar8,(string *)&local_168);
          __cxa_throw(pcVar8,&compile_error::typeinfo,compile_error::~compile_error);
        }
        statement_function::set_mem_fn((statement_function *)*ppsVar10);
      }
      ppsVar10 = ppsVar10 + 1;
      if (ppsVar10 == ppsVar9) {
        ppsVar10 = pppsVar11[1];
        pppsVar11 = pppsVar11 + 1;
        ppsVar9 = ppsVar10 + 0x40;
      }
    } while( true );
  }
  pcVar8 = (compile_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&body,"Wrong grammar for struct definition, expect <id>",
             (allocator *)&local_168);
  compile_error::compile_error(pcVar8,(string *)&body);
  __cxa_throw(pcVar8,&compile_error::typeinfo,compile_error::~compile_error);
}

Assistant:

statement_base *
	method_struct::translate(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		tree_type<token_base *> &t = static_cast<token_expr *>(raw.front().at(1))->get_tree();
		if (t.root().data() == nullptr)
			throw internal_error("Null pointer accessed.");
		if (t.root().data()->get_type() != token_types::id)
			throw compile_error("Wrong grammar for struct definition, expect <id>");
		std::string name = static_cast<token_id *>(t.root().data())->get_id();
		std::deque<statement_base *> body;
		context->compiler->translate({raw.begin() + 1, raw.end()}, body);
		for (auto &ptr: body) {
			try {
				switch (ptr->get_type()) {
				default:
					throw compile_error("Unexpected statement in structure definition.");
				case statement_types::var_:
					break;
				case statement_types::function_:
					static_cast<statement_function *>(ptr)->set_mem_fn();
					break;
				}
			}
			catch (const cs::exception &e) {
				throw e;
			}
			catch (const std::exception &e) {
				throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
			}
		}
		if (raw.front().size() == 5)
			return new statement_struct(name, static_cast<token_expr *>(raw.front().at(3))->get_tree(), body, context,
			                            raw.front().back());
		else
			return new statement_struct(name, tree_type<token_base *>(), body, context, raw.front().back());
	}